

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * kwssys::SystemTools::GetFilenameName(string *filename)

{
  long lVar1;
  string *in_RSI;
  string *in_RDI;
  size_type slash_pos;
  char separators;
  
  lVar1 = std::__cxx11::string::find_last_of((char)in_RSI,0x2f);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)in_RDI,in_RSI);
  }
  else {
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)in_RSI);
  }
  return in_RDI;
}

Assistant:

std::string SystemTools::GetFilenameName(const std::string& filename)
{
#if defined(_WIN32) || defined(KWSYS_SYSTEMTOOLS_SUPPORT_WINDOWS_SLASHES)
  const char* separators = "/\\";
#else
  char separators = '/';
#endif
  std::string::size_type slash_pos = filename.find_last_of(separators);
  if (slash_pos != std::string::npos) {
    return filename.substr(slash_pos + 1);
  } else {
    return filename;
  }
}